

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

Vector3fi * __thiscall
pbrt::Transform::operator()(Vector3fi *__return_storage_ptr__,Transform *this,Vector3fi *v)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  float fVar6;
  undefined8 uVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  Vector3f VVar36;
  Tuple3<pbrt::Vector3,_float> local_30;
  Vector3f local_24;
  undefined1 auVar20 [56];
  undefined1 auVar25 [60];
  
  auVar10._0_4_ =
       (v->super_Vector3<pbrt::Interval<float>_>).
       super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.low;
  auVar10._4_4_ =
       (v->super_Vector3<pbrt::Interval<float>_>).
       super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.high;
  auVar10._8_4_ =
       (v->super_Vector3<pbrt::Interval<float>_>).
       super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.low;
  auVar10._12_4_ =
       (v->super_Vector3<pbrt::Interval<float>_>).
       super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.high;
  uVar7 = *(undefined8 *)
           &(v->super_Vector3<pbrt::Interval<float>_>).
            super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.high;
  fVar35 = (float)((ulong)uVar7 >> 0x20);
  auVar25 = ZEXT460((uint)fVar35);
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)(v->super_Vector3<pbrt::Interval<float>_>).
                                                super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
                                                y.high),0x10);
  auVar13._0_4_ = (float)uVar7 + auVar10._0_4_;
  auVar13._4_4_ = fVar35 + auVar10._4_4_;
  auVar13._8_4_ = auVar10._8_4_ + 0.0;
  auVar13._12_4_ = auVar10._12_4_ + 0.0;
  auVar17._8_4_ = 0x3f000000;
  auVar17._0_8_ = 0x3f0000003f000000;
  auVar17._12_4_ = 0x3f000000;
  auVar10 = vmulps_avx512vl(auVar13,auVar17);
  auVar20 = (undefined1  [56])0x0;
  auVar17 = ZEXT416((uint)(((v->super_Vector3<pbrt::Interval<float>_>).
                            super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.low +
                           (v->super_Vector3<pbrt::Interval<float>_>).
                           super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.high) * 0.5));
  bVar9 = Vector3fi::IsExact(v);
  fVar35 = auVar10._0_4_;
  if (bVar9) {
    FVar1 = (this->m).m[0][0];
    FVar2 = (this->m).m[1][0];
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    FVar3 = (this->m).m[0][2];
    FVar4 = (this->m).m[1][2];
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 1),
                            ZEXT416((uint)(this->m).m[1][1]),0x10);
    auVar15 = vinsertps_avx(ZEXT416((uint)FVar1),ZEXT416((uint)FVar2),0x10);
    auVar14 = vinsertps_avx(ZEXT416((uint)FVar3),ZEXT416((uint)FVar4),0x10);
    auVar21._0_4_ = fVar35 * auVar15._0_4_;
    auVar21._4_4_ = fVar35 * auVar15._4_4_;
    auVar21._8_4_ = fVar35 * auVar15._8_4_;
    auVar21._12_4_ = fVar35 * auVar15._12_4_;
    auVar15 = vmovshdup_avx(auVar10);
    auVar26._0_4_ = auVar15._0_4_ * auVar13._0_4_;
    auVar26._4_4_ = auVar15._4_4_ * auVar13._4_4_;
    auVar26._8_4_ = auVar15._8_4_ * auVar13._8_4_;
    auVar26._12_4_ = auVar15._12_4_ * auVar13._12_4_;
    auVar13 = vandps_avx(auVar31,auVar21);
    auVar15 = vandps_avx(auVar31,auVar26);
    auVar11 = vbroadcastss_avx512vl(auVar17);
    auVar22._0_4_ = auVar11._0_4_ * auVar14._0_4_;
    auVar22._4_4_ = auVar11._4_4_ * auVar14._4_4_;
    auVar22._8_4_ = auVar11._8_4_ * auVar14._8_4_;
    auVar22._12_4_ = auVar11._12_4_ * auVar14._12_4_;
    uVar8 = *(ulong *)(this->m).m[2];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar8;
    auVar14 = vandps_avx(auVar31,auVar22);
    auVar18._0_4_ = auVar13._0_4_ + auVar15._0_4_ + auVar14._0_4_;
    auVar18._4_4_ = auVar13._4_4_ + auVar15._4_4_ + auVar14._4_4_;
    auVar18._8_4_ = auVar13._8_4_ + auVar15._8_4_ + auVar14._8_4_;
    auVar18._12_4_ = auVar13._12_4_ + auVar15._12_4_ + auVar14._12_4_;
    auVar11._8_4_ = 0x34400002;
    auVar11._0_8_ = 0x3440000234400002;
    auVar11._12_4_ = 0x34400002;
    auVar12 = vmulps_avx512vl(auVar18,auVar11);
    auVar23._0_4_ = fVar35 * (float)uVar8;
    auVar23._4_4_ = auVar10._4_4_ * (float)(uVar8 >> 0x20);
    auVar23._8_4_ = auVar10._8_4_ * 0.0;
    auVar23._12_4_ = auVar10._12_4_ * 0.0;
    auVar13 = vandps_avx(auVar31,auVar23);
    auVar11 = vmovshdup_avx(auVar23);
    auVar15 = vhaddps_avx(auVar13,auVar13);
    FVar5 = (this->m).m[2][2];
    auVar13 = vmulss_avx512f(auVar17,ZEXT416((uint)FVar5));
    auVar13 = vandps_avx(auVar13,auVar31);
    local_30.z = (auVar15._0_4_ + auVar13._0_4_) * 1.7881396e-07;
  }
  else {
    VVar36 = Vector3fi::Error(v);
    auVar24._0_4_ = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._4_60_ = auVar25;
    auVar19._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar19._8_56_ = auVar20;
    auVar32._8_4_ = 0x7fffffff;
    auVar32._0_8_ = 0x7fffffff7fffffff;
    auVar32._12_4_ = 0x7fffffff;
    FVar1 = (this->m).m[0][0];
    FVar2 = (this->m).m[1][0];
    FVar3 = (this->m).m[0][2];
    FVar4 = (this->m).m[1][2];
    auVar18 = vmovshdup_avx(auVar19._0_16_);
    fVar16 = VVar36.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar33._4_4_ = fVar16;
    auVar33._0_4_ = fVar16;
    auVar33._8_4_ = fVar16;
    auVar33._12_4_ = fVar16;
    auVar34._4_4_ = auVar24._0_4_;
    auVar34._0_4_ = auVar24._0_4_;
    auVar34._8_4_ = auVar24._0_4_;
    auVar34._12_4_ = auVar24._0_4_;
    auVar14 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 1),
                            ZEXT416((uint)(this->m).m[1][1]),0x10);
    auVar11 = vinsertps_avx(ZEXT416((uint)FVar1),ZEXT416((uint)FVar2),0x10);
    auVar13 = vandps_avx(auVar32,auVar14);
    auVar15 = vandps_avx(auVar32,auVar11);
    auVar12._0_4_ = auVar18._0_4_ * auVar13._0_4_;
    auVar12._4_4_ = auVar18._4_4_ * auVar13._4_4_;
    auVar12._8_4_ = auVar18._8_4_ * auVar13._8_4_;
    auVar12._12_4_ = auVar18._12_4_ * auVar13._12_4_;
    auVar15 = vfmadd213ps_fma(auVar33,auVar15,auVar12);
    auVar29 = vinsertps_avx(ZEXT416((uint)FVar3),ZEXT416((uint)FVar4),0x10);
    auVar13 = vandps_avx(auVar29,auVar32);
    auVar12 = vfmadd213ps_fma(auVar34,auVar13,auVar15);
    auVar28._0_4_ = fVar35 * auVar11._0_4_;
    auVar28._4_4_ = fVar35 * auVar11._4_4_;
    auVar28._8_4_ = fVar35 * auVar11._8_4_;
    auVar28._12_4_ = fVar35 * auVar11._12_4_;
    auVar11 = vmovshdup_avx(auVar10);
    auVar26._0_4_ = auVar11._0_4_ * auVar14._0_4_;
    auVar26._4_4_ = auVar11._4_4_ * auVar14._4_4_;
    auVar26._8_4_ = auVar11._8_4_ * auVar14._8_4_;
    auVar26._12_4_ = auVar11._12_4_ * auVar14._12_4_;
    auVar13 = vandps_avx(auVar32,auVar28);
    auVar15 = vandps_avx(auVar32,auVar26);
    auVar14 = vbroadcastss_avx512vl(auVar17);
    auVar30._0_4_ = auVar14._0_4_ * auVar29._0_4_;
    auVar30._4_4_ = auVar14._4_4_ * auVar29._4_4_;
    auVar30._8_4_ = auVar14._8_4_ * auVar29._8_4_;
    auVar30._12_4_ = auVar14._12_4_ * auVar29._12_4_;
    auVar14 = vandps_avx(auVar30,auVar32);
    auVar29._0_4_ = auVar14._0_4_ + auVar15._0_4_ + auVar13._0_4_;
    auVar29._4_4_ = auVar14._4_4_ + auVar15._4_4_ + auVar13._4_4_;
    auVar29._8_4_ = auVar14._8_4_ + auVar15._8_4_ + auVar13._8_4_;
    auVar29._12_4_ = auVar14._12_4_ + auVar15._12_4_ + auVar13._12_4_;
    auVar15._8_4_ = 0x34400002;
    auVar15._0_8_ = 0x3440000234400002;
    auVar15._12_4_ = 0x34400002;
    auVar13 = vmulps_avx512vl(auVar29,auVar15);
    fVar16 = (this->m).m[2][0];
    auVar27 = ZEXT416((uint)fVar16);
    auVar14._8_4_ = 0x3f800002;
    auVar14._0_8_ = 0x3f8000023f800002;
    auVar14._12_4_ = 0x3f800002;
    auVar12 = vfmadd231ps_avx512vl(auVar13,auVar12,auVar14);
    fVar6 = (this->m).m[2][1];
    auVar13 = vandps_avx(auVar32,ZEXT416((uint)fVar16));
    auVar15 = vandps_avx(ZEXT416((uint)fVar6),auVar32);
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * auVar15._0_4_)),auVar19._0_16_,auVar13)
    ;
    FVar5 = (this->m).m[2][2];
    auVar13 = vandps_avx(auVar32,ZEXT416((uint)FVar5));
    auVar29 = vfmadd213ss_fma(auVar13,auVar24._0_16_,auVar15);
    auVar13 = vandps_avx(auVar32,ZEXT416((uint)(fVar35 * fVar16)));
    fVar6 = auVar11._0_4_ * fVar6;
    auVar11 = ZEXT416((uint)fVar6);
    auVar15 = vandps_avx(auVar32,ZEXT416((uint)fVar6));
    auVar14 = vmulss_avx512f(auVar17,ZEXT416((uint)FVar5));
    auVar14 = vandps_avx(auVar14,auVar32);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((auVar13._0_4_ + auVar15._0_4_ + auVar14._0_4_) *
                                            1.7881396e-07)),auVar29,ZEXT416(0x3f800002));
    local_30.z = auVar13._0_4_;
  }
  auVar13 = vfmadd213ss_fma(ZEXT416((uint)FVar1),auVar10,auVar26);
  auVar15 = vfmadd231ss_fma(auVar11,auVar10,auVar27);
  local_30._0_8_ = vmovlps_avx(auVar12);
  auVar14 = vfmadd231ss_avx512f(auVar13,auVar17,ZEXT416((uint)FVar3));
  auVar13 = vmovshdup_avx(auVar26);
  auVar15 = vfmadd231ss_avx512f(auVar15,auVar17,ZEXT416((uint)FVar5));
  auVar10 = vfmadd231ss_fma(auVar13,auVar10,ZEXT416((uint)FVar2));
  local_24.super_Tuple3<pbrt::Vector3,_float>.x = auVar14._0_4_;
  auVar10 = vfmadd231ss_avx512f(auVar10,auVar17,ZEXT416((uint)FVar4));
  local_24.super_Tuple3<pbrt::Vector3,_float>.y = auVar10._0_4_;
  local_24.super_Tuple3<pbrt::Vector3,_float>.z = auVar15._0_4_;
  Vector3fi::Vector3fi(__return_storage_ptr__,&local_24,(Vector3f *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3fi Transform::operator()(const Vector3fi &v) const {
    Float x = Float(v.x), y = Float(v.y), z = Float(v.z);
    Vector3f vOutError;
    if (v.IsExact()) {
        vOutError.x = gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    } else {
        Vector3f vInError = v.Error();
        vOutError.x = (gamma(3) + 1) * (std::abs(m[0][0]) * vInError.x +
                                        std::abs(m[0][1]) * vInError.y +
                                        std::abs(m[0][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = (gamma(3) + 1) * (std::abs(m[1][0]) * vInError.x +
                                        std::abs(m[1][1]) * vInError.y +
                                        std::abs(m[1][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = (gamma(3) + 1) * (std::abs(m[2][0]) * vInError.x +
                                        std::abs(m[2][1]) * vInError.y +
                                        std::abs(m[2][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    }

    Float xp = m[0][0] * x + m[0][1] * y + m[0][2] * z;
    Float yp = m[1][0] * x + m[1][1] * y + m[1][2] * z;
    Float zp = m[2][0] * x + m[2][1] * y + m[2][2] * z;

    return Vector3fi(Vector3f(xp, yp, zp), vOutError);
}